

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
try_handle_next_demand
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this)

{
  atomic_refcounted_t *paVar1;
  timer_manager_t *ptVar2;
  pop_result_t pVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  at_exit_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_simple_not_mtsafe_st_env_infrastructure_cpp:631:7)>
  work_tracking_stopper;
  execution_demand_t demand;
  execution_demand_t local_48;
  timespec local_18;
  int extraout_var;
  
  local_48.m_receiver = (agent_t *)0x0;
  local_48.m_limit = (control_block_t *)0x0;
  local_48.m_mbox_id = 0;
  local_48.m_msg_type._M_target = (type_info *)&void::typeinfo;
  local_48.m_message_ref.m_obj = (message_t *)0x0;
  local_48.m_demand_handler = (demand_handler_pfn_t)0x0;
  pVar3 = event_queue_impl_t::pop(&this->m_event_queue,&local_48);
  if (pVar3 == empty_queue) {
    iVar4 = (*((this->m_timer_manager)._M_t.
               super___uniq_ptr_impl<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_so_5::timer_manager_t_*,_std::default_delete<so_5::timer_manager_t>_>
               .super__Head_base<0UL,_so_5::timer_manager_t_*,_false>._M_head_impl)->
              _vptr_timer_manager_t[6])();
    if ((char)iVar4 == '\0') {
      ptVar2 = (this->m_timer_manager)._M_t.
               super___uniq_ptr_impl<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_so_5::timer_manager_t_*,_std::default_delete<so_5::timer_manager_t>_>
               .super__Head_base<0UL,_so_5::timer_manager_t_*,_false>._M_head_impl;
      iVar4 = (*ptVar2->_vptr_timer_manager_t[3])(ptVar2,86400000000000);
      uVar5 = CONCAT44(extraout_var,iVar4);
      if (uVar5 != 0 && -1 < extraout_var) {
        local_18.tv_sec = uVar5 / 1000000000;
        local_18.tv_nsec = uVar5 % 1000000000;
        do {
          iVar4 = nanosleep(&local_18,&local_18);
          if (iVar4 != -1) break;
          piVar6 = __errno_location();
        } while (*piVar6 == 4);
      }
    }
    else {
      (*(this->super_environment_infrastructure_t)._vptr_environment_infrastructure_t[3])(this);
    }
  }
  else {
    (*local_48.m_demand_handler)
              ((current_thread_id_t)
               (this->m_default_disp).
               super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
               .m_thread_id._M_thread,&local_48);
  }
  if (local_48.m_message_ref.m_obj != (message_t *)0x0) {
    LOCK();
    paVar1 = &(local_48.m_message_ref.m_obj)->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_48.m_message_ref.m_obj != (message_t *)0x0)) {
      (*(local_48.m_message_ref.m_obj)->_vptr_message_t[1])();
    }
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::try_handle_next_demand()
	{
		execution_demand_t demand;
		const auto pop_result = m_event_queue.pop( demand );
		// If there is no demands we must go to sleep for some time...
		if( event_queue_impl_t::pop_result_t::empty_queue == pop_result )
			{
				// We must try to sleep for next timer but only if
				// there is any timer.
				if( !m_timer_manager->empty() )
					{
						// Tracking time for 'waiting' state must be turned on.
						m_activity_tracker.wait_start_if_not_started();

						const auto sleep_time =
								m_timer_manager->timeout_before_nearest_timer(
										// We can use very large value here.
										std::chrono::hours(24) );

						std::this_thread::sleep_for( sleep_time );
					}
				else
					// There are no demands and there are no timers.
					// Environment's work must be finished.
					stop();
			}
		else
			{
				// Tracking time for 'waiting' must be turned off, but
				// tracking time for 'working' must be tuned on and then off again.
				m_activity_tracker.wait_stopped();
				m_activity_tracker.work_started();
				auto work_tracking_stopper = so_5::details::at_scope_exit(
						[this]{ m_activity_tracker.work_stopped(); } );

				// There is at least one demand to process.
				m_default_disp.handle_demand( demand );
			}
	}